

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  Node *pNVar1;
  Node *pNVar2;
  pointer pcVar3;
  Node *pNVar4;
  undefined8 uVar5;
  void *pvVar6;
  uint8_t *puVar7;
  InfoType IVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  long lVar12;
  
  pNVar2 = this->mKeyVals;
  pNVar4 = pNVar2 + startIdx;
  pNVar1 = pNVar2 + startIdx;
  paVar10 = &(pNVar1->mData).first.field_2;
  (pNVar1->mData).first._M_dataplus._M_p = (pointer)paVar10;
  pcVar3 = pNVar1[-1].mData.first._M_dataplus._M_p;
  paVar9 = &pNVar2[startIdx - 1].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar9) {
    uVar5 = *(undefined8 *)((long)&pNVar2[startIdx - 1].mData.first.field_2 + 8);
    paVar10->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(pNVar1->mData).first.field_2 + 8) = uVar5;
  }
  else {
    (pNVar4->mData).first._M_dataplus._M_p = pcVar3;
    (pNVar4->mData).first.field_2._M_allocated_capacity =
         pNVar4[-1].mData.first.field_2._M_allocated_capacity;
  }
  (pNVar4->mData).first._M_string_length = pNVar4[-1].mData.first._M_string_length;
  pNVar4[-1].mData.first._M_dataplus._M_p = (pointer)paVar9;
  pNVar4[-1].mData.first._M_string_length = 0;
  pNVar4[-1].mData.first.field_2._M_local_buf[0] = '\0';
  pvVar6 = pNVar4[-1].mData.second.ptr;
  (pNVar4->mData).second.definition = pNVar4[-1].mData.second.definition;
  (pNVar4->mData).second.ptr = pvVar6;
  if (startIdx - 1 != insertion_idx) {
    lVar11 = (insertion_idx - startIdx) + 1;
    lVar12 = startIdx * 0x30;
    do {
      pNVar4 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&pNVar4[-1].mData.first._M_dataplus._M_p + lVar12),
                 (string *)((long)&pNVar4[-2].mData.first._M_dataplus._M_p + lVar12));
      uVar5 = *(undefined8 *)((long)&pNVar4[-2].mData.second.ptr + lVar12);
      *(undefined8 *)((long)&pNVar4[-1].mData.second.definition + lVar12) =
           *(undefined8 *)((long)&pNVar4[-2].mData.second.definition + lVar12);
      *(undefined8 *)((long)&pNVar4[-1].mData.second.ptr + lVar12) = uVar5;
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + -0x30;
    } while (lVar11 != 0);
  }
  if (startIdx != insertion_idx) {
    puVar7 = this->mInfo;
    IVar8 = this->mInfoInc;
    do {
      puVar7[startIdx] = (char)IVar8 + puVar7[startIdx - 1];
      puVar7 = this->mInfo;
      IVar8 = this->mInfoInc;
      if (0xff < puVar7[startIdx] + IVar8) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }